

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

void capnp::_::WireHelpers::zeroObject
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *tag,word *ptr)

{
  Kind KVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  WirePointer *typedPtr;
  uint uVar5;
  ulong uVar6;
  WirePointer *pWVar7;
  uint uVar8;
  Iterator __end7;
  Fault f;
  Fault f_2;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> local_60;
  long local_40;
  Fault local_38;
  
  if (segment->readOnly != false) {
    return;
  }
  switch((tag->offsetAndKind).value & 3) {
  case 0:
    uVar6 = (ulong)(tag->field_1).structRef.ptrCount.value;
    if (uVar6 != 0) {
      pWVar7 = (WirePointer *)(ptr + (tag->field_1).structRef.dataSize.value);
      do {
        zeroObject(segment,capTable,pWVar7);
        pWVar7 = pWVar7 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    iVar3 = (uint)(tag->field_1).structRef.ptrCount.value +
            (uint)(tag->field_1).structRef.dataSize.value;
    if (iVar3 == 0) {
      return;
    }
    uVar4 = iVar3 * 8;
    break;
  case 1:
    uVar4 = (tag->field_1).upper32Bits;
    switch(uVar4 & 7) {
    case 0:
      return;
    default:
      uVar6 = (ulong)(uint)(&BITS_PER_ELEMENT_TABLE)[(byte)uVar4 & 7] * (ulong)(uVar4 >> 3) + 0x3f;
      if ((int)(uVar6 >> 6) == 0) {
        return;
      }
      uVar4 = (uint)(uVar6 >> 3) & 0xfffffff8;
      break;
    case 6:
      if (7 < uVar4) {
        uVar6 = (ulong)(uVar4 >> 3);
        pWVar7 = (WirePointer *)ptr;
        do {
          zeroObject(segment,capTable,pWVar7);
          pWVar7 = pWVar7 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      if (uVar4 < 8) {
        return;
      }
      uVar4 = uVar4 & 0xfffffff8;
      break;
    case 7:
      KVar1 = (Kind)ptr->content;
      local_60.left = KVar1 & OTHER;
      local_60.result = local_60.left == STRUCT;
      local_60.right = STRUCT;
      local_60.op.content.ptr = " == ";
      local_60.op.content.size_ = 5;
      if (!local_60.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[54]>
                  (&local_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x2c8,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                   "_kjCondition,\"Don\'t know how to handle non-STRUCT inline composite.\"",
                   &local_60,(char (*) [54])"Don\'t know how to handle non-STRUCT inline composite."
                  );
        kj::_::Debug::Fault::fatal(&local_38);
      }
      uVar2 = KVar1 >> 2 & 0x1fffffff;
      uVar4 = (uint)*(ushort *)((long)&ptr->content + 6);
      local_60.left = STRUCT;
      if ((uVar4 != 0) && (uVar2 != 0)) {
        local_40 = (ulong)*(ushort *)((long)&ptr->content + 4) << 3;
        uVar8 = 0;
        pWVar7 = (WirePointer *)ptr;
        do {
          pWVar7 = (WirePointer *)((long)&(pWVar7->offsetAndKind).value + local_40);
          uVar5 = uVar4;
          do {
            pWVar7 = pWVar7 + 1;
            zeroObject(segment,capTable,pWVar7);
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar2);
      }
      uVar6 = ((ulong)*(ushort *)((long)&ptr->content + 6) +
              (ulong)*(ushort *)((long)&ptr->content + 4)) * (ulong)uVar2;
      if (0x1ffffffe < uVar6) {
        zeroObject::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_60);
      }
      iVar3 = (int)uVar6 + 1;
      if (iVar3 == 0) {
        return;
      }
      memset(ptr,0,(ulong)(uint)(iVar3 * 8));
      return;
    }
    break;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
              ((Fault *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x2e5,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
               (char (*) [24])"Unexpected FAR pointer.");
    goto LAB_00243175;
  case 3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x2ea,FAILED,(char *)0x0,"\"Unexpected OTHER pointer.\"",
               (char (*) [26])"Unexpected OTHER pointer.");
LAB_00243175:
    kj::_::Debug::Fault::~Fault((Fault *)&local_60);
    return;
  }
  memset(ptr,0,(ulong)uVar4);
  return;
}

Assistant:

static void zeroObject(SegmentBuilder* segment, CapTableBuilder* capTable,
                         WirePointer* tag, word* ptr) {
    // We shouldn't zero out external data linked into the message.
    if (!segment->isWritable()) return;

    switch (tag->kind()) {
      case WirePointer::STRUCT: {
        WirePointer* pointerSection =
            reinterpret_cast<WirePointer*>(ptr + tag->structRef.dataSize.get());
        for (auto i: kj::zeroTo(tag->structRef.ptrCount.get())) {
          zeroObject(segment, capTable, pointerSection + i);
        }
        zeroMemory(ptr, tag->structRef.wordSize());
        break;
      }
      case WirePointer::LIST: {
        switch (tag->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            zeroMemory(ptr, roundBitsUpToWords(
                upgradeBound<uint64_t>(tag->listRef.elementCount()) *
                dataBitsPerElement(tag->listRef.elementSize())));
            break;
          }
          case ElementSize::POINTER: {
            WirePointer* typedPtr = reinterpret_cast<WirePointer*>(ptr);
            auto count = tag->listRef.elementCount() * (ONE * POINTERS / ELEMENTS);
            for (auto i: kj::zeroTo(count)) {
              zeroObject(segment, capTable, typedPtr + i);
            }
            zeroMemory(typedPtr, count);
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            WirePointer* elementTag = reinterpret_cast<WirePointer*>(ptr);

            KJ_ASSERT(elementTag->kind() == WirePointer::STRUCT,
                  "Don't know how to handle non-STRUCT inline composite.");
            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            auto count = elementTag->inlineCompositeListElementCount();
            if (pointerCount > ZERO * POINTERS) {
              word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  zeroObject(segment, capTable, reinterpret_cast<WirePointer*>(pos));
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }

            auto wordsPerElement = elementTag->structRef.wordSize() / ELEMENTS;
            zeroMemory(ptr, assertMaxBits<SEGMENT_WORD_COUNT_BITS>(POINTER_SIZE_IN_WORDS +
                upgradeBound<uint64_t>(count) * wordsPerElement, []() {
                  KJ_FAIL_ASSERT("encountered list pointer in builder which is too large to "
                      "possibly fit in a segment. Bug in builder code?");
                }));
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        KJ_FAIL_ASSERT("Unexpected OTHER pointer.") {
          break;
        }
        break;
    }
  }